

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

void __thiscall kj::_::LogExpectation::~LogExpectation(LogExpectation *this)

{
  bool bVar1;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__LogExpectation_00626770;
  bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
  if ((!bVar1) && (_kjCondition.value = &this->seen, this->seen == false)) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[30],kj::LogSeverity&,kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
               ,0x2d,FAILED,"seen",
               "_kjCondition,\"expected log message not seen\", severity, substring",&_kjCondition,
               (char (*) [30])"expected log message not seen",&this->severity,&this->substring);
    Debug::Fault::fatal(&f);
  }
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

LogExpectation::~LogExpectation() {
  if (!unwindDetector.isUnwinding()) {
    KJ_ASSERT(seen, "expected log message not seen", severity, substring);
  }
}